

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_fop_QQQ(DisasContext_conflict8 *dc,int rd,int rs1,int rs2,
                _func_void_TCGContext_ptr_TCGv_ptr_conflict *gen)

{
  TCGContext_conflict8 *tcg_ctx;
  uint dst;
  
  tcg_ctx = dc->uc->tcg_ctx;
  gen_op_load_fpr_QT0(tcg_ctx,(rs1 & 1U) << 5 | rs1 & 0x1cU);
  gen_op_load_fpr_QT1(tcg_ctx,rs2 & 0x1cU | (rs2 & 1U) << 5);
  (*gen)(tcg_ctx,tcg_ctx->cpu_env);
  gen_helper_check_ieee_exceptions(tcg_ctx,(TCGv_i32)tcg_ctx->cpu_fsr,tcg_ctx->cpu_env);
  dst = rd & 0x1cU | (rd & 1U) << 5;
  gen_op_store_QT0_fpr(tcg_ctx,dst);
  gen_update_fprs_dirty(dc,dst);
  return;
}

Assistant:

static inline void gen_fop_QQQ(DisasContext *dc, int rd, int rs1, int rs2,
                               void (*gen)(TCGContext *, TCGv_ptr))
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    gen_op_load_fpr_QT0(tcg_ctx, QFPREG(rs1));
    gen_op_load_fpr_QT1(tcg_ctx, QFPREG(rs2));

    gen(tcg_ctx, tcg_ctx->cpu_env);
    gen_helper_check_ieee_exceptions(tcg_ctx, tcg_ctx->cpu_fsr, tcg_ctx->cpu_env);

    gen_op_store_QT0_fpr(tcg_ctx, QFPREG(rd));
    gen_update_fprs_dirty(dc, QFPREG(rd));
}